

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<false> * __thiscall
LabelSinglePropertyState<false>::Uint
          (LabelSinglePropertyState<false> *this,Context<false> *ctx,uint v)

{
  int iVar1;
  undefined4 extraout_var;
  BaseState<false> *pBVar2;
  
  ctx->key = ctx->key + 7;
  ctx->key_length = ctx->key_length - 7;
  iVar1 = (*(ctx->label_object_state).super_BaseState<false>._vptr_BaseState[2])
                    ((float)v,&ctx->label_object_state);
  pBVar2 = (BaseState<false> *)CONCAT44(extraout_var,iVar1);
  if (pBVar2 != (BaseState<false> *)0x0) {
    pBVar2 = ctx->previous_state;
  }
  return pBVar2;
}

Assistant:

BaseState<audit>* Uint(Context<audit>& ctx, unsigned v)
  {
    // skip "_label_"
    ctx.key += 7;
    ctx.key_length -= 7;

    if (ctx.label_object_state.Uint(ctx, v) == nullptr)
      return nullptr;

    return ctx.previous_state;
  }